

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createModuleTests(TestContext *testCtx)

{
  pointer pcVar1;
  InstanceContext *pIVar2;
  deUint8 inputValue;
  ShaderPermutation SVar3;
  long *plVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *testCodeFragments;
  size_type *psVar5;
  long lVar6;
  InstanceContext *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848;
  undefined1 local_838 [32];
  _Base_ptr local_818;
  size_t sStack_810;
  string local_808;
  undefined1 local_7e8 [32];
  _Base_ptr local_7c8;
  size_t sStack_7c0;
  string local_7b0;
  string local_790;
  string local_770;
  TestCaseGroup *local_750;
  string name;
  string local_710;
  ShaderElement *local_6f0;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  long *local_688 [2];
  long local_678 [2];
  long *local_668 [2];
  long local_658 [2];
  long *local_648 [2];
  long local_638 [2];
  RGBA defaultColors [4];
  uint local_5e8;
  RGBA invertedColors [4];
  ShaderElement local_5a8;
  ShaderElement local_560;
  ShaderElement local_518;
  ShaderElement local_4d0;
  ShaderElement local_488;
  InstanceContext local_438;
  ShaderElement local_358;
  ShaderElement local_310;
  ShaderElement local_2c8;
  ShaderElement local_280;
  ShaderElement local_238;
  InstanceContext local_1f0;
  InstanceContext local_110;
  
  defaultColors[0].m_value = 0;
  defaultColors[1].m_value = 0;
  defaultColors[2].m_value = 0;
  defaultColors[3].m_value = 0;
  invertedColors[0].m_value = 0;
  invertedColors[1].m_value = 0;
  invertedColors[2].m_value = 0;
  invertedColors[3].m_value = 0;
  local_750 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(local_750,testCtx,"module","Multiple entry points into shaders")
  ;
  local_5a8.moduleName._M_dataplus._M_p = (pointer)&local_5a8.moduleName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"module","");
  local_7e8._0_8_ = local_7e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"main","");
  ShaderElement::ShaderElement
            (&local_358,&local_5a8.moduleName,(string *)local_7e8,VK_SHADER_STAGE_VERTEX_BIT);
  pcVar1 = local_838 + 0x10;
  local_838._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"module","");
  local_858._M_allocated_capacity = (size_type)&local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"main","");
  ShaderElement::ShaderElement
            (&local_310,(string *)local_838,(string *)&local_858,VK_SHADER_STAGE_GEOMETRY_BIT);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"module","");
  _Var8._M_p = (pointer)&local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff788,"main","");
  ShaderElement::ShaderElement
            (&local_2c8,&name,(string *)&stack0xfffffffffffff788,
             VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"module","");
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"main","");
  ShaderElement::ShaderElement
            (&local_280,&local_7b0,&local_808,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"module","");
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"main","");
  testCodeFragments =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x10;
  ShaderElement::ShaderElement(&local_238,&local_770,&local_790,VK_SHADER_STAGE_FRAGMENT_BIT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var8._M_p != &local_868) {
    operator_delete(_Var8._M_p,local_868._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_allocated_capacity != &local_848) {
    operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1);
  }
  if ((pointer)local_838._0_8_ != pcVar1) {
    operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
  }
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.moduleName._M_dataplus._M_p != &local_5a8.moduleName.field_2) {
    operator_delete(local_5a8.moduleName._M_dataplus._M_p,
                    local_5a8.moduleName.field_2._M_allocated_capacity + 1);
  }
  getDefaultColors(&defaultColors);
  getInvertedDefaultColors(&invertedColors);
  local_7e8._0_8_ = local_7e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"same_module","");
  local_838._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"");
  local_5a8.moduleName.field_2._8_8_ = &local_5a8.moduleName._M_string_length;
  local_5a8.moduleName.field_2._M_allocated_capacity = 0;
  local_5a8.moduleName._M_dataplus._M_p = (pointer)0x0;
  local_5a8.moduleName._M_string_length = 0;
  local_5a8.entryName._M_string_length = 0;
  local_5a8.entryName._M_dataplus._M_p = (pointer)local_5a8.moduleName.field_2._8_8_;
  createInstanceContext<5ul>
            (&local_438,(SpirVAssembly *)&local_358,(ShaderElement_0_ *)&local_5a8,testCodeFragments
            );
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (local_750,(string *)local_7e8,(string *)local_838,createCombinedModule,
             runAndVerifyDefaultPipeline,&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.failMessageTemplate._M_dataplus._M_p != &local_438.failMessageTemplate.field_2) {
    operator_delete(local_438.failMessageTemplate._M_dataplus._M_p,
                    local_438.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_438.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_438.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_438);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_5a8);
  if ((pointer)local_838._0_8_ != pcVar1) {
    operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
  }
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  local_6f0 = &local_518;
  inputValue = '\0';
  do {
    SVar3 = getShaderPermutation(inputValue);
    local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"vert","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_790);
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_770.field_2._M_allocated_capacity = *psVar5;
      local_770.field_2._8_8_ = plVar4[3];
    }
    else {
      local_770.field_2._M_allocated_capacity = *psVar5;
      local_770._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_770._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_770);
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_808.field_2._M_allocated_capacity = *psVar5;
      local_808.field_2._8_8_ = plVar4[3];
    }
    else {
      local_808.field_2._M_allocated_capacity = *psVar5;
      local_808._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_808._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_808);
    local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_7b0.field_2._M_allocated_capacity = *psVar5;
      local_7b0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_7b0.field_2._M_allocated_capacity = *psVar5;
      local_7b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_7b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_7b0);
    _Var8._M_p = (pointer)&local_868;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar7) {
      local_868._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_868._8_8_ = plVar4[3];
    }
    else {
      local_868._M_allocated_capacity = paVar7->_M_allocated_capacity;
      _Var8._M_p = (pointer)*plVar4;
    }
    *plVar4 = (long)paVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(&stack0xfffffffffffff788);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar7) {
      local_848._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_848._8_8_ = plVar4[3];
      local_858._M_allocated_capacity = (size_type)&local_848;
    }
    else {
      local_848._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_858._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar4;
    }
    local_858._8_8_ = plVar4[1];
    *plVar4 = (long)paVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_858._M_local_buf);
    local_838._0_8_ = local_838 + 0x10;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_838._16_8_ = *psVar5;
      local_838._24_8_ = plVar4[3];
    }
    else {
      local_838._16_8_ = *psVar5;
      local_838._0_8_ = (size_type *)*plVar4;
    }
    local_838._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_838);
    local_7e8._0_8_ = local_7e8 + 0x10;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_7e8._16_8_ = *psVar5;
      local_7e8._24_8_ = plVar4[3];
    }
    else {
      local_7e8._16_8_ = *psVar5;
      local_7e8._0_8_ = (size_type *)*plVar4;
    }
    local_7e8._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_7e8);
    local_5a8.moduleName._M_dataplus._M_p = (pointer)&local_5a8.moduleName.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_5a8.moduleName.field_2._M_allocated_capacity = *psVar5;
      local_5a8.moduleName.field_2._8_8_ = plVar4[3];
    }
    else {
      local_5a8.moduleName.field_2._M_allocated_capacity = *psVar5;
      local_5a8.moduleName._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_5a8.moduleName._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_5a8);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      name.field_2._M_allocated_capacity = *psVar5;
      name.field_2._8_8_ = plVar4[3];
    }
    else {
      name.field_2._M_allocated_capacity = *psVar5;
      name._M_dataplus._M_p = (pointer)*plVar4;
    }
    name._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8.moduleName._M_dataplus._M_p != &local_5a8.moduleName.field_2) {
      operator_delete(local_5a8.moduleName._M_dataplus._M_p,
                      local_5a8.moduleName.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_allocated_capacity != &local_848) {
      operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != &local_868) {
      operator_delete(_Var8._M_p,local_868._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
      operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._M_dataplus._M_p != &local_790.field_2) {
      operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
    }
    local_7e8._0_8_ = local_7e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"vert","");
    local_858._M_allocated_capacity = (size_type)&local_848;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"vert","");
    plVar4 = (long *)std::__cxx11::string::append(local_858._M_local_buf);
    local_838._0_8_ = local_838 + 0x10;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_838._16_8_ = *psVar5;
      local_838._24_8_ = plVar4[3];
    }
    else {
      local_838._16_8_ = *psVar5;
      local_838._0_8_ = (size_type *)*plVar4;
    }
    local_838._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_5a8,(string *)local_7e8,(string *)local_838,VK_SHADER_STAGE_VERTEX_BIT);
    _Var8._M_p = (pointer)&local_868;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff788,"geom","");
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"geom","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_808);
    local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_7b0.field_2._M_allocated_capacity = *psVar5;
      local_7b0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_7b0.field_2._M_allocated_capacity = *psVar5;
      local_7b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_7b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_560,(string *)&stack0xfffffffffffff788,&local_7b0,VK_SHADER_STAGE_GEOMETRY_BIT
              );
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"tessc","");
    local_648[0] = local_638;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"tessc","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_648);
    local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_790.field_2._M_allocated_capacity = *psVar5;
      local_790.field_2._8_8_ = plVar4[3];
    }
    else {
      local_790.field_2._M_allocated_capacity = *psVar5;
      local_790._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_790._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_518,&local_770,&local_790,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
    local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"tesse","");
    local_668[0] = local_658;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"tesse","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_668);
    local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_710.field_2._M_allocated_capacity = *psVar5;
      local_710.field_2._8_8_ = plVar4[3];
    }
    else {
      local_710.field_2._M_allocated_capacity = *psVar5;
      local_710._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_710._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_4d0,&local_6a8,&local_710,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"frag","");
    local_688[0] = local_678;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"frag","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_688);
    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_6e8.field_2._M_allocated_capacity = *psVar5;
      local_6e8.field_2._8_8_ = plVar4[3];
    }
    else {
      local_6e8.field_2._M_allocated_capacity = *psVar5;
      local_6e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_6e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement(&local_488,&local_6c8,&local_6e8,VK_SHADER_STAGE_FRAGMENT_BIT);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
      operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
    }
    if (local_688[0] != local_678) {
      operator_delete(local_688[0],local_678[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_710._M_dataplus._M_p != &local_710.field_2) {
      operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
    }
    if (local_668[0] != local_658) {
      operator_delete(local_668[0],local_658[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._M_dataplus._M_p != &local_790.field_2) {
      operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
    }
    if (local_648[0] != local_638) {
      operator_delete(local_648[0],local_638[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
      operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != &local_868) {
      operator_delete(_Var8._M_p,local_868._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_allocated_capacity != &local_848) {
      operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
    local_5e8 = (uint)SVar3._2_3_;
    _Var8._M_p = (pointer)&local_868;
    if ((SVar3._3_2_ + local_5e8 + SVar3._1_4_ + SVar3._0_4_ + (uint)SVar3.fragmentPermutation & 1)
        == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff788,"");
      local_838._16_8_ = 0;
      local_838._0_8_ = (pointer)0x0;
      local_838._8_8_ = 0;
      local_838._24_8_ = local_838 + 8;
      sStack_810 = 0;
      local_7e8._16_8_ = 0;
      local_7e8._0_8_ = (pointer)0x0;
      local_7e8._8_8_ = 0;
      local_7e8._24_8_ = local_7e8 + 8;
      sStack_7c0 = 0;
      local_858._8_8_ = 0;
      local_848._M_allocated_capacity = local_848._M_allocated_capacity & 0xffffffffffffff00;
      __return_storage_ptr__ = &local_110;
      local_858._M_allocated_capacity = (size_type)&local_848;
      local_818 = (_Base_ptr)local_838._24_8_;
      local_7c8 = (_Base_ptr)local_7e8._24_8_;
      createInstanceContext<5ul>
                (__return_storage_ptr__,(SpirVAssembly *)&local_5a8,
                 (ShaderElement_0_ *)defaultColors,&defaultColors,(RGBA (*) [4])local_838,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_7e8,(StageToSpecConstantMap *)&DAT_00000001,(qpTestResult)&local_858,
                 (string *)_Var8._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_858._M_allocated_capacity != &local_848) {
        operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1)
        ;
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)local_7e8);
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (local_750,&name,(string *)&stack0xfffffffffffff788,createMultipleEntries,
                 runAndVerifyDefaultPipeline,__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.failMessageTemplate._M_dataplus._M_p !=
          &local_110.failMessageTemplate.field_2) {
        operator_delete(local_110.failMessageTemplate._M_dataplus._M_p,
                        local_110.failMessageTemplate.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_110.specConstants._M_t);
      pIVar2 = &local_110;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff788,"");
      __return_storage_ptr__ = &local_1f0;
      local_838._16_8_ = 0;
      local_838._0_8_ = (pointer)0x0;
      local_838._8_8_ = 0;
      local_838._24_8_ = local_838 + 8;
      sStack_810 = 0;
      local_7e8._16_8_ = 0;
      local_7e8._0_8_ = (pointer)0x0;
      local_7e8._8_8_ = 0;
      local_7e8._24_8_ = local_7e8 + 8;
      sStack_7c0 = 0;
      local_858._8_8_ = 0;
      local_848._M_allocated_capacity = local_848._M_allocated_capacity & 0xffffffffffffff00;
      local_858._M_allocated_capacity = (size_type)&local_848;
      local_818 = (_Base_ptr)local_838._24_8_;
      local_7c8 = (_Base_ptr)local_7e8._24_8_;
      createInstanceContext<5ul>
                (__return_storage_ptr__,(SpirVAssembly *)&local_5a8,
                 (ShaderElement_0_ *)defaultColors,&invertedColors,(RGBA (*) [4])local_838,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_7e8,(StageToSpecConstantMap *)&DAT_00000001,(qpTestResult)&local_858,
                 (string *)_Var8._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_858._M_allocated_capacity != &local_848) {
        operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1)
        ;
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)local_7e8);
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (local_750,&name,(string *)&stack0xfffffffffffff788,createMultipleEntries,
                 runAndVerifyDefaultPipeline,__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.failMessageTemplate._M_dataplus._M_p !=
          &local_1f0.failMessageTemplate.field_2) {
        operator_delete(local_1f0.failMessageTemplate._M_dataplus._M_p,
                        local_1f0.failMessageTemplate.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_1f0.specConstants._M_t);
      pIVar2 = &local_1f0;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(pIVar2->testCodeFragments)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
                 *)__return_storage_ptr__);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_838);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != &local_868) {
      operator_delete(_Var8._M_p,local_868._M_allocated_capacity + 1);
    }
    lVar6 = -0x168;
    paVar7 = &local_488.entryName.field_2;
    do {
      if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar7->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                        paVar7->_M_allocated_capacity + 1);
      }
      if (&paVar7->_M_allocated_capacity + -4 != (size_type *)(&paVar7->_M_allocated_capacity)[-6])
      {
        operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                        (&paVar7->_M_allocated_capacity)[-4] + 1);
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar7->_M_allocated_capacity + -9);
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    inputValue = inputValue + '\x01';
  } while (inputValue != ' ');
  lVar6 = -0x168;
  paVar7 = &local_238.entryName.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    if (&paVar7->_M_allocated_capacity + -4 != (size_type *)(&paVar7->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                      (&paVar7->_M_allocated_capacity)[-4] + 1);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -9);
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0);
  return local_750;
}

Assistant:

tcu::TestCaseGroup* createModuleTests(tcu::TestContext& testCtx)
{
	RGBA								defaultColors[4];
	RGBA								invertedColors[4];
	de::MovePtr<tcu::TestCaseGroup>		moduleTests			(new tcu::TestCaseGroup(testCtx, "module", "Multiple entry points into shaders"));

	const ShaderElement					combinedPipeline[]	=
	{
		ShaderElement("module", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_GEOMETRY_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_FRAGMENT_BIT)
	};

	getDefaultColors(defaultColors);
	getInvertedDefaultColors(invertedColors);
	addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), "same_module", "", createCombinedModule, runAndVerifyDefaultPipeline, createInstanceContext(combinedPipeline, map<string, string>()));

	const char* numbers[] =
	{
		"1", "2"
	};

	for (deInt8 idx = 0; idx < 32; ++idx)
	{
		ShaderPermutation			permutation		= getShaderPermutation(idx);
		string						name			= string("vert") + numbers[permutation.vertexPermutation] + "_geom" + numbers[permutation.geometryPermutation] + "_tessc" + numbers[permutation.tesscPermutation] + "_tesse" + numbers[permutation.tessePermutation] + "_frag" + numbers[permutation.fragmentPermutation];
		const ShaderElement			pipeline[]		=
		{
			ShaderElement("vert",	string("vert") +	numbers[permutation.vertexPermutation],		VK_SHADER_STAGE_VERTEX_BIT),
			ShaderElement("geom",	string("geom") +	numbers[permutation.geometryPermutation],	VK_SHADER_STAGE_GEOMETRY_BIT),
			ShaderElement("tessc",	string("tessc") +	numbers[permutation.tesscPermutation],		VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
			ShaderElement("tesse",	string("tesse") +	numbers[permutation.tessePermutation],		VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
			ShaderElement("frag",	string("frag") +	numbers[permutation.fragmentPermutation],	VK_SHADER_STAGE_FRAGMENT_BIT)
		};

		// If there are an even number of swaps, then it should be no-op.
		// If there are an odd number, the color should be flipped.
		if ((permutation.vertexPermutation + permutation.geometryPermutation + permutation.tesscPermutation + permutation.tessePermutation + permutation.fragmentPermutation) % 2 == 0)
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, defaultColors, map<string, string>()));
		}
		else
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, invertedColors, map<string, string>()));
		}
	}
	return moduleTests.release();
}